

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O2

bool benchmark::anon_unknown_1::ReadIntFromFile(char *file,long *value)

{
  int __fd;
  ssize_t sVar1;
  long lVar2;
  bool bVar3;
  char *err;
  char line [1024];
  
  bVar3 = false;
  __fd = open(file,0);
  if (__fd != -1) {
    memset(line,0,0x400);
    sVar1 = read(__fd,line,0x3ff);
    if (sVar1 == 0) {
      internal::CheckHandler::CheckHandler
                ((CheckHandler *)&err,"read(fd, line, sizeof(line) - 1)",
                 "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/sysinfo.cc"
                 ,"ReadIntFromFile",0x4f);
      internal::CheckHandler::~CheckHandler((CheckHandler *)&err);
    }
    internal::GetNullLogInstance();
    lVar2 = strtol(line,&err,10);
    if ((line[0] == '\0') || ((*err != '\n' && (*err != '\0')))) {
      bVar3 = false;
    }
    else {
      *value = lVar2;
      bVar3 = true;
    }
    close(__fd);
  }
  return bVar3;
}

Assistant:

bool ReadIntFromFile(const char* file, long* value) {
  bool ret = false;
  int fd = open(file, O_RDONLY);
  if (fd != -1) {
    char line[1024];
    char* err;
    memset(line, '\0', sizeof(line));
    CHECK(read(fd, line, sizeof(line) - 1));
    const long temp_value = strtol(line, &err, 10);
    if (line[0] != '\0' && (*err == '\n' || *err == '\0')) {
      *value = temp_value;
      ret = true;
    }
    close(fd);
  }
  return ret;
}